

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O0

seconds __thiscall hedg::MarketGenerator::calc_time(MarketGenerator *this)

{
  int local_1c;
  MarketGenerator *pMStack_18;
  int total_secs;
  MarketGenerator *this_local;
  
  if (this->time_unit_ == hours) {
    local_1c = this->time_span_ * 0xe10;
  }
  else if (this->time_unit_ == mins) {
    local_1c = this->time_span_ * 0x3c;
  }
  else {
    local_1c = this->time_span_;
  }
  pMStack_18 = this;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&this_local,&local_1c);
  return (seconds)(rep)this_local;
}

Assistant:

std::chrono::seconds MarketGenerator::calc_time() {
	int total_secs = 0;
	if (time_unit_ == Timing::time_unit::hours)
		total_secs += 3600 * time_span_;
	else if (time_unit_ == Timing::time_unit::mins)
		total_secs += 60 * time_span_;
	else
		total_secs += time_span_;
	return std::chrono::seconds(total_secs);
}